

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilePS.cpp
# Opt level: O1

void __thiscall chrono::ChFile_ps::DrawGraphAxes(ChFile_ps *this,ChFile_ps_graph_setting *msetting)

{
  ChStreamOutAscii *this_00;
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  undefined8 uVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ChStreamOutAscii *pCVar18;
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  double dVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  double dVar55;
  undefined1 auVar56 [16];
  char numstr [20];
  double local_1c8;
  ChVector2<double> local_188;
  ChVector2<double> local_178;
  ChVector2<double> local_168;
  ChVector2<double> local_158;
  ChVector2<double> local_148;
  ChVector2<double> local_138;
  ChVector2<double> local_128;
  ChVector2<double> local_118;
  ChVector2<double> local_108;
  ChVector2<double> local_f8;
  ChVector2<double> local_e8;
  ChVector2<double> local_d0;
  ChVector2<double> local_c0;
  ChVector2<double> local_b0;
  ChVector2<double> local_a0;
  ChVector2<double> local_90;
  ChVector2<double> local_80;
  ChVector2<double> local_70;
  ChVector2<double> local_60;
  ChVector2<double> local_50;
  ChVector2<double> local_40;
  
  this_00 = &(this->super_ChStreamOutAsciiFile).super_ChStreamOutAscii;
  ChStreamOutAscii::operator<<(this_00,"GS\n");
  dVar20 = (this->G_p).m_data[0];
  dVar21 = (this->G_p).m_data[1];
  dVar1 = (this->Gs_p).m_data[0];
  dVar11 = dVar20 + dVar1 * 0.5;
  dVar2 = (this->Gs_p).m_data[1];
  dVar12 = dVar21 + dVar2 * 0.5;
  auVar50._0_8_ = 1.0 / (this->Gz).m_data[0];
  auVar50._8_8_ = 0;
  auVar51._8_8_ = 0;
  auVar51._0_8_ = (this->Gc_g).m_data[0];
  auVar53._8_8_ = 0;
  auVar53._0_8_ = dVar20 - dVar11;
  auVar22 = vfmadd213sd_fma(auVar53,auVar50,auVar51);
  dVar52 = auVar22._0_8_;
  auVar49._0_8_ = 1.0 / (this->Gz).m_data[1];
  auVar49._8_8_ = 0;
  auVar54._8_8_ = 0;
  auVar54._0_8_ = (this->Gc_g).m_data[1];
  auVar56._8_8_ = 0;
  auVar56._0_8_ = dVar21 - dVar12;
  auVar22 = vfmadd213sd_fma(auVar56,auVar49,auVar54);
  dVar55 = auVar22._0_8_;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = (dVar20 + dVar1) - dVar11;
  auVar22 = vfmadd213sd_fma(auVar22,auVar50,auVar51);
  dVar20 = auVar22._0_8_;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = (dVar21 + dVar2) - dVar12;
  auVar22 = vfmadd213sd_fma(auVar19,auVar49,auVar54);
  dVar21 = auVar22._0_8_;
  ChStreamOutAscii::operator<<(this_00,"GS\n");
  local_e8.m_data[0] = (this->G_p).m_data[0];
  local_e8.m_data[1] = (this->G_p).m_data[1];
  local_40.m_data[0] = (this->Gs_p).m_data[0];
  local_40.m_data[1] = (this->Gs_p).m_data[1];
  ClipRectangle(this,&local_e8,&local_40,PAGE);
  SetFont(this,"/Helvetica",(msetting->Xaxis).numbers_fontsize);
  local_1c8 = (msetting->Xaxis).ticks_step;
  auVar32._0_8_ = dVar52 / local_1c8;
  auVar32._8_8_ = 0;
  auVar22 = vroundsd_avx(auVar32,auVar32,10);
  local_1c8 = local_1c8 * auVar22._0_8_;
  if (local_1c8 < dVar20) {
    do {
      if (200.0 < (dVar20 - dVar52) / (msetting->Xaxis).ticks_step) break;
      if (msetting->gridx == true) {
        auVar3._8_8_ = 0;
        auVar3._0_8_ = (this->Gz).m_data[0];
        auVar23._8_8_ = 0;
        auVar23._0_8_ = (this->Gs_p).m_data[0] * 0.5 + (this->G_p).m_data[0];
        auVar41._8_8_ = 0;
        auVar41._0_8_ = local_1c8 - (this->Gc_g).m_data[0];
        auVar22 = vfmadd132sd_fma(auVar41,auVar23,auVar3);
        dVar1 = (this->Gc_g).m_data[1];
        auVar42._8_8_ = 0;
        auVar42._0_8_ = (this->Gz).m_data[1];
        auVar33._8_8_ = 0;
        auVar33._0_8_ = (this->Gs_p).m_data[1] * 0.5 + (this->G_p).m_data[1];
        auVar45._8_8_ = 0;
        auVar45._0_8_ = dVar55 - dVar1;
        auVar19 = vfmadd213sd_fma(auVar45,auVar42,auVar33);
        auVar24._8_8_ = 0;
        auVar24._0_8_ = dVar21 - dVar1;
        auVar32 = vfmadd213sd_fma(auVar24,auVar42,auVar33);
        pCVar18 = ChStreamOutAscii::operator<<(this_00,msetting->grid_width);
        ChStreamOutAscii::operator<<(pCVar18," LW\n");
        SetRGB(this,(msetting->grid_color).r,(msetting->grid_color).g,(msetting->grid_color).b);
        local_108.m_data[0] = auVar22._0_8_;
        local_108.m_data[1] = auVar32._0_8_;
        local_f8.m_data[0] = auVar22._0_8_;
        local_f8.m_data[1] = auVar19._0_8_;
        DrawLine(this,&local_f8,&local_108,PAGE);
      }
      if ((msetting->Xaxis).ticks == true) {
        auVar4._8_8_ = 0;
        auVar4._0_8_ = (this->Gz).m_data[0];
        auVar25._8_8_ = 0;
        auVar25._0_8_ = (this->Gs_p).m_data[0] * 0.5 + (this->G_p).m_data[0];
        auVar43._8_8_ = 0;
        auVar43._0_8_ = local_1c8 - (this->Gc_g).m_data[0];
        auVar22 = vfmadd132sd_fma(auVar43,auVar25,auVar4);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = (this->Gz).m_data[1];
        auVar26._8_8_ = 0;
        auVar26._0_8_ = 0.0 - (this->Gc_g).m_data[1];
        auVar34._8_8_ = 0;
        auVar34._0_8_ = (this->Gs_p).m_data[1] * 0.5 + (this->G_p).m_data[1];
        auVar19 = vfmadd132sd_fma(auVar26,auVar34,auVar5);
        pCVar18 = ChStreamOutAscii::operator<<(this_00,(msetting->Xaxis).ticks_width);
        ChStreamOutAscii::operator<<(pCVar18," LW\n");
        SetRGB(this,(msetting->Xaxis).axis_color.r,(msetting->Xaxis).axis_color.g,
               (msetting->Xaxis).axis_color.b);
        local_128.m_data[0] = auVar22._0_8_;
        local_128.m_data[1] = auVar19._0_8_ + 0.1;
        local_118.m_data[0] = auVar22._0_8_;
        local_118.m_data[1] = auVar19._0_8_;
        DrawLine(this,&local_118,&local_128,PAGE);
      }
      if ((msetting->Xaxis).numbers == true) {
        SetRGB(this,(msetting->Xaxis).numbers_color.r,(msetting->Xaxis).numbers_color.g,
               (msetting->Xaxis).numbers_color.b);
        auVar16._8_8_ = 0;
        auVar16._0_8_ = local_1c8;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = (this->Gz).m_data[0];
        auVar27._8_8_ = 0;
        auVar27._0_8_ = (this->Gs_p).m_data[0] * 0.5 + (this->G_p).m_data[0];
        auVar35._8_8_ = 0;
        auVar35._0_8_ = local_1c8 - (this->Gc_g).m_data[0];
        auVar22 = vfmadd132sd_fma(auVar35,auVar27,auVar6);
        dVar1 = (this->G_p).m_data[1];
        auVar14._8_8_ = 0x7fffffffffffffff;
        auVar14._0_8_ = 0x7fffffffffffffff;
        auVar19 = vandpd_avx512vl(auVar16,auVar14);
        uVar13 = vcmpsd_avx512f(auVar19,ZEXT816(0x3cd203af9ee75616),1);
        sprintf((char *)&local_e8,
                (this->super_ChStreamOutAsciiFile).super_ChStreamOutAscii.number_format,
                (ulong)!(bool)((byte)uVar13 & 1) * (long)local_1c8);
        local_138.m_data[0] = auVar22._0_8_ + 0.1;
        local_138.m_data[1] = dVar1 + 0.16;
        DrawText(this,&local_138,(char *)&local_e8,PAGE,LEFT);
      }
      local_1c8 = local_1c8 + (msetting->Xaxis).ticks_step;
    } while (local_1c8 < dVar20);
  }
  SetFont(this,"/Helvetica",(msetting->Yaxis).numbers_fontsize);
  local_1c8 = (msetting->Yaxis).ticks_step;
  auVar36._0_8_ = dVar55 / local_1c8;
  auVar36._8_8_ = 0;
  auVar22 = vroundsd_avx(auVar36,auVar36,10);
  local_1c8 = local_1c8 * auVar22._0_8_;
  if (local_1c8 < dVar21) {
    do {
      if (200.0 < (dVar21 - dVar55) / (msetting->Yaxis).ticks_step) break;
      if (msetting->gridy == true) {
        dVar1 = (this->Gc_g).m_data[0];
        auVar46._8_8_ = 0;
        auVar46._0_8_ = (this->Gz).m_data[0];
        auVar28._8_8_ = 0;
        auVar28._0_8_ = (this->Gs_p).m_data[0] * 0.5 + (this->G_p).m_data[0];
        auVar47._8_8_ = 0;
        auVar47._0_8_ = dVar52 - dVar1;
        auVar19 = vfmadd213sd_fma(auVar47,auVar46,auVar28);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = (this->Gz).m_data[1];
        auVar37._8_8_ = 0;
        auVar37._0_8_ = (this->Gs_p).m_data[1] * 0.5 + (this->G_p).m_data[1];
        auVar48._8_8_ = 0;
        auVar48._0_8_ = local_1c8 - (this->Gc_g).m_data[1];
        auVar22 = vfmadd132sd_fma(auVar48,auVar37,auVar7);
        auVar38._8_8_ = 0;
        auVar38._0_8_ = dVar20 - dVar1;
        auVar32 = vfmadd213sd_fma(auVar38,auVar46,auVar28);
        pCVar18 = ChStreamOutAscii::operator<<(this_00,msetting->grid_width);
        ChStreamOutAscii::operator<<(pCVar18," LW\n");
        SetRGB(this,(msetting->grid_color).r,(msetting->grid_color).g,(msetting->grid_color).b);
        local_158.m_data[0] = auVar32._0_8_;
        local_158.m_data[1] = auVar22._0_8_;
        local_148.m_data[0] = auVar19._0_8_;
        local_148.m_data[1] = auVar22._0_8_;
        DrawLine(this,&local_148,&local_158,PAGE);
      }
      if ((msetting->Yaxis).ticks == true) {
        auVar8._8_8_ = 0;
        auVar8._0_8_ = (this->Gz).m_data[0];
        auVar29._8_8_ = 0;
        auVar29._0_8_ = (this->Gs_p).m_data[0] * 0.5 + (this->G_p).m_data[0];
        auVar44._8_8_ = 0;
        auVar44._0_8_ = 0.0 - (this->Gc_g).m_data[0];
        auVar22 = vfmadd132sd_fma(auVar44,auVar29,auVar8);
        auVar9._8_8_ = 0;
        auVar9._0_8_ = (this->Gz).m_data[1];
        auVar30._8_8_ = 0;
        auVar30._0_8_ = local_1c8 - (this->Gc_g).m_data[1];
        auVar39._8_8_ = 0;
        auVar39._0_8_ = (this->Gs_p).m_data[1] * 0.5 + (this->G_p).m_data[1];
        auVar19 = vfmadd132sd_fma(auVar30,auVar39,auVar9);
        pCVar18 = ChStreamOutAscii::operator<<(this_00,(msetting->Yaxis).ticks_width);
        ChStreamOutAscii::operator<<(pCVar18," LW\n");
        SetRGB(this,(msetting->Yaxis).axis_color.r,(msetting->Yaxis).axis_color.g,
               (msetting->Yaxis).axis_color.b);
        local_178.m_data[0] = auVar22._0_8_ + 0.1;
        local_178.m_data[1] = auVar19._0_8_;
        local_168.m_data[0] = auVar22._0_8_;
        local_168.m_data[1] = auVar19._0_8_;
        DrawLine(this,&local_168,&local_178,PAGE);
      }
      if ((msetting->Yaxis).numbers == true) {
        SetRGB(this,(msetting->Yaxis).numbers_color.r,(msetting->Yaxis).numbers_color.g,
               (msetting->Yaxis).numbers_color.b);
        auVar17._8_8_ = 0;
        auVar17._0_8_ = local_1c8;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = (this->Gz).m_data[1];
        auVar31._8_8_ = 0;
        auVar31._0_8_ = (this->Gs_p).m_data[1] * 0.5 + (this->G_p).m_data[1];
        auVar40._8_8_ = 0;
        auVar40._0_8_ = local_1c8 - (this->Gc_g).m_data[1];
        auVar22 = vfmadd132sd_fma(auVar40,auVar31,auVar10);
        dVar1 = (this->G_p).m_data[0];
        auVar15._8_8_ = 0x7fffffffffffffff;
        auVar15._0_8_ = 0x7fffffffffffffff;
        auVar19 = vandpd_avx512vl(auVar17,auVar15);
        uVar13 = vcmpsd_avx512f(auVar19,ZEXT816(0x3cd203af9ee75616),1);
        sprintf((char *)&local_e8,
                (this->super_ChStreamOutAsciiFile).super_ChStreamOutAscii.number_format,
                (ulong)!(bool)((byte)uVar13 & 1) * (long)local_1c8);
        local_188.m_data[0] = dVar1 + 0.16;
        local_188.m_data[1] = auVar22._0_8_ + 0.1;
        DrawText(this,&local_188,(char *)&local_e8,PAGE,LEFT);
      }
      local_1c8 = local_1c8 + (msetting->Yaxis).ticks_step;
    } while (local_1c8 < dVar21);
  }
  pCVar18 = ChStreamOutAscii::operator<<(this_00,(msetting->Xaxis).axis_width);
  ChStreamOutAscii::operator<<(pCVar18," LW\n");
  SetRGB(this,(msetting->Xaxis).axis_color.r,(msetting->Xaxis).axis_color.g,
         (msetting->Xaxis).axis_color.b);
  local_50.m_data[1] = 0.0;
  local_60.m_data[1] = 0.0;
  local_60.m_data[0] = dVar20;
  local_50.m_data[0] = dVar52;
  DrawLine(this,&local_50,&local_60,GRAPH);
  pCVar18 = ChStreamOutAscii::operator<<(this_00,(msetting->Yaxis).axis_width);
  ChStreamOutAscii::operator<<(pCVar18," LW\n");
  SetRGB(this,(msetting->Yaxis).axis_color.r,(msetting->Yaxis).axis_color.g,
         (msetting->Yaxis).axis_color.b);
  local_70.m_data[0] = 0.0;
  local_80.m_data[0] = 0.0;
  local_80.m_data[1] = dVar21;
  local_70.m_data[1] = dVar55;
  DrawLine(this,&local_70,&local_80,GRAPH);
  dVar20 = (this->G_p).m_data[0];
  dVar21 = (this->G_p).m_data[1];
  dVar1 = (this->Gs_p).m_data[0];
  SetRGB(this,(msetting->Xaxis).label_color.r,(msetting->Xaxis).label_color.g,
         (msetting->Xaxis).label_color.b);
  SetFont(this,*(char **)(ch_font_labels + (long)(msetting->Xaxis).label_fontname * 8),
          (msetting->Xaxis).label_fontsize);
  local_90.m_data[0] = dVar20 + dVar1 + -0.4;
  local_90.m_data[1] = dVar21 + 0.4;
  DrawText(this,&local_90,(msetting->Xaxis).label,PAGE,RIGHT);
  dVar20 = (this->G_p).m_data[0];
  dVar21 = (this->G_p).m_data[1];
  dVar1 = (this->Gs_p).m_data[1];
  SetRGB(this,(msetting->Yaxis).label_color.r,(msetting->Yaxis).label_color.g,
         (msetting->Yaxis).label_color.b);
  SetFont(this,*(char **)(ch_font_labels + (long)(msetting->Yaxis).label_fontname * 8),
          (msetting->Yaxis).label_fontsize);
  local_a0.m_data[0] = dVar20 + 0.7;
  local_a0.m_data[1] = dVar21 + dVar1 + -0.3;
  DrawText(this,&local_a0,(msetting->Yaxis).label,PAGE,LEFT);
  ChStreamOutAscii::operator<<(this_00,"GR\n");
  pCVar18 = ChStreamOutAscii::operator<<(this_00,0.0);
  ChStreamOutAscii::operator<<(pCVar18," SG\n");
  local_b0.m_data[0] = (this->G_p).m_data[0];
  local_b0.m_data[1] = (this->G_p).m_data[1];
  local_c0.m_data[0] = (this->Gs_p).m_data[0];
  local_c0.m_data[1] = (this->Gs_p).m_data[1];
  DrawRectangle(this,&local_b0,&local_c0,PAGE,false);
  if (msetting->title[0] != '\0') {
    SetFont(this,*(char **)(ch_font_labels + (long)msetting->title_fontname * 8),
            msetting->title_fontsize);
    SetRGB(this,(msetting->title_color).r,(msetting->title_color).g,(msetting->title_color).b);
    local_d0.m_data[0] = (this->G_p).m_data[0] + 0.0;
    local_d0.m_data[1] = (this->G_p).m_data[1] + (this->Gs_p).m_data[1] + 0.4;
    DrawText(this,&local_d0,msetting->title,PAGE,LEFT);
  }
  ChStreamOutAscii::operator<<(this_00,"GR\n");
  return;
}

Assistant:

void ChFile_ps::DrawGraphAxes(ChFile_ps_graph_setting* msetting) {
    ChVector2<> cpt, cp1, cp2, lole_g, upri_g, org_g, org_p;

    // save old gfx mode
    GrSave();

    // some coords
    lole_g = To_graph_from_page(G_p);
    cpt.x() = G_p.x() + Gs_p.x();
    cpt.y() = G_p.y() + Gs_p.y();
    upri_g = To_graph_from_page(cpt);
    org_g.x() = org_g.y() = 0;
    org_p = To_page_from_graph(org_g);

    // Set clip region
    GrSave();
    ClipToGraph();  // ClipRectangle(G_p,Gs_p,PS_SPACE_PAGE);

    // X AXIS ticks, grid numbers
    //

    SetFont((char*)"/Helvetica", msetting->Xaxis.numbers_fontsize);

    double stpx = ceil(lole_g.x() / msetting->Xaxis.ticks_step) * msetting->Xaxis.ticks_step;
    for (double w = stpx; w < upri_g.x(); w += msetting->Xaxis.ticks_step) {
        if ((upri_g.x() - lole_g.x()) / msetting->Xaxis.ticks_step > 200.0)
            break;
        cpt.x() = w;
        cpt.y() = 0;
        if (msetting->gridx) {
            cp1 = cpt;
            cp2 = cp1;
            cp1.y() = lole_g.y();
            cp2.y() = upri_g.y();
            cp1 = To_page_from_graph(cp1);
            cp2 = To_page_from_graph(cp2);
            SetWidth(msetting->grid_width);
            SetRGB(msetting->grid_color);
            DrawLine(cp1, cp2, Space::PAGE);
        }
        if (msetting->Xaxis.ticks) {
            cp1 = To_page_from_graph(cpt);
            cp2.x() = cp1.x();
            cp2.y() = cp1.y() + 0.10;
            SetWidth(msetting->Xaxis.ticks_width);
            SetRGB(msetting->Xaxis.axis_color);
            DrawLine(cp1, cp2, Space::PAGE);
        }
        if (msetting->Xaxis.numbers) {
            char numstr[20];
            SetRGB(msetting->Xaxis.numbers_color);
            cp1 = To_page_from_graph(cpt);
            cp1.y() = G_p.y() + 0.16;
            cp1.x() = cp1.x() + 0.1;
            double tw = w;
            if (fabs(w) < 1.e-15)
                tw = 0;
            sprintf(numstr, this->number_format, tw);
            DrawText(cp1, numstr, Space::PAGE);
        }
    }

    // Y AXIS grid, numbers, ticks
    //

    SetFont((char*)"/Helvetica", msetting->Yaxis.numbers_fontsize);

    double stpy = ceil(lole_g.y() / msetting->Yaxis.ticks_step) * msetting->Yaxis.ticks_step;
    for (double h = stpy; h < upri_g.y(); h += msetting->Yaxis.ticks_step) {
        if ((upri_g.y() - lole_g.y()) / msetting->Yaxis.ticks_step > 200.0)
            break;
        cpt.x() = 0;
        cpt.y() = h;
        if (msetting->gridy) {
            cp1 = cpt;
            cp2 = cp1;
            cp1.x() = lole_g.x();
            cp2.x() = upri_g.x();
            cp1 = To_page_from_graph(cp1);
            cp2 = To_page_from_graph(cp2);
            SetWidth(msetting->grid_width);
            SetRGB(msetting->grid_color);
            DrawLine(cp1, cp2, Space::PAGE);
        }
        if (msetting->Yaxis.ticks) {
            cp1 = To_page_from_graph(cpt);
            cp2.x() = cp1.x() + 0.10;
            cp2.y() = cp1.y();
            SetWidth(msetting->Yaxis.ticks_width);
            SetRGB(msetting->Yaxis.axis_color);
            DrawLine(cp1, cp2, Space::PAGE);
        }
        if (msetting->Yaxis.numbers) {
            char numstr[20];
            SetRGB(msetting->Yaxis.numbers_color);
            cp1 = To_page_from_graph(cpt);
            cp1.x() = G_p.x() + 0.16;
            cp1.y() = cp1.y() + 0.1;
            double th = h;
            if (fabs(th) < 1.e-15)
                th = 0;
            sprintf(numstr, this->number_format, th);
            DrawText(cp1, numstr, Space::PAGE);
        }
    }

    // draw x axis line
    SetWidth(msetting->Xaxis.axis_width);
    SetRGB(msetting->Xaxis.axis_color);
    cp1 = org_g;
    cp2 = org_g;
    cp1.x() = lole_g.x();
    cp2.x() = upri_g.x();
    DrawLine(cp1, cp2, Space::GRAPH);

    // draw y axis line
    SetWidth(msetting->Yaxis.axis_width);
    SetRGB(msetting->Yaxis.axis_color);
    cp1 = org_g;
    cp2 = org_g;
    cp1.y() = lole_g.y();
    cp2.y() = upri_g.y();
    DrawLine(cp1, cp2, Space::GRAPH);

    // draw xy labels
    //if (msetting->Xaxis.label) { // pointers to static arrays are always TRUE
    cp1.x() = G_p.x() + Gs_p.x() - 0.4;
    cp1.y() = G_p.y() + 0.4;
    SetRGB(msetting->Xaxis.label_color);
    SetFont(ch_font_labels[msetting->Xaxis.label_fontname], msetting->Xaxis.label_fontsize);
    DrawText(cp1, msetting->Xaxis.label, Space::PAGE, Justification::RIGHT);
    //}
    //if (msetting->Yaxis.label) { // pointers to static arrays are always TRUE
    cp1.x() = G_p.x() + 0.7;
    cp1.y() = G_p.y() + Gs_p.y() - 0.3;
    SetRGB(msetting->Yaxis.label_color);
    SetFont(ch_font_labels[msetting->Yaxis.label_fontname], msetting->Yaxis.label_fontsize);
    DrawText(cp1, msetting->Yaxis.label, Space::PAGE);
    //}

    // restore old gfx mode -without the clipping region
    GrRestore();

    // draw enclosing frame
    SetGray(0.0);
    DrawRectangle(G_p, Gs_p, Space::PAGE, false);

    // draw title
    //if (msetting->title) // pointers to static arrays are always TRUE
    if (*msetting->title != 0) {
        SetFont(ch_font_labels[msetting->title_fontname], msetting->title_fontsize);
        SetRGB(msetting->title_color);
        cpt.x() = G_p.x() + 0.0;
        cpt.y() = G_p.y() + Gs_p.y() + 0.4;
        DrawText(cpt, msetting->title, Space::PAGE);
    }

    // return to original gfx mode
    GrRestore();
}